

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall
amrex::Amr::Amr(Amr *this,RealBox *rb,int max_level_in,Vector<int,_std::allocator<int>_> *n_cell_in,
               int coord,LevelBld *a_levelbld)

{
  undefined8 *in_RDI;
  undefined8 in_R9;
  Amr *in_stack_00000a20;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  int coord_00;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int max_level_in_00;
  RealBox *in_stack_ffffffffffffff18;
  AmrCore *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff30;
  
  max_level_in_00 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  coord_00 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x137f41e);
  AmrCore::AmrCore(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,max_level_in_00,
                   in_stack_ffffffffffffff08,coord_00,in_stack_fffffffffffffef8,
                   in_stack_ffffffffffffff30);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x137f46b);
  *in_RDI = &PTR__Amr_01aa4a38;
  std::__cxx11::string::string((string *)(in_RDI + 0x1d));
  std::__cxx11::string::string((string *)(in_RDI + 0x21));
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::Vector((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            *)0x137f4c3);
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0x137f4df);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x137f4fb);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x137f517);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x137f533);
  std::__cxx11::string::string((string *)(in_RDI + 0x36));
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0x137f56b);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x137f587);
  std::__cxx11::string::string((string *)(in_RDI + 0x43));
  std::__cxx11::string::string((string *)(in_RDI + 0x50));
  std::__cxx11::string::string((string *)(in_RDI + 0x54));
  std::ofstream::ofstream(in_RDI + 0x5a);
  std::ofstream::ofstream(in_RDI + 0x9a);
  std::ofstream::ofstream(in_RDI + 0xda);
  Vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ::Vector((Vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
            *)0x137f648);
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x137f661);
  std::__cxx11::string::string((string *)(in_RDI + 0x121));
  std::__cxx11::string::string((string *)(in_RDI + 0x125));
  std::__cxx11::string::string((string *)(in_RDI + 0x129));
  in_RDI[0x12d] = in_R9;
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
              *)0x137f6d4);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
              *)0x137f6ed);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
              *)0x137f706);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
              *)0x137f71f);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
              *)0x137f738);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
              *)0x137f751);
  Initialize();
  InitAmr(in_stack_00000a20);
  return;
}

Assistant:

Amr::Amr (const RealBox* rb, int max_level_in, const Vector<int>& n_cell_in, int coord,
          LevelBld* a_levelbld)
    :
    AmrCore(rb,max_level_in,n_cell_in,coord),
    levelbld(a_levelbld)
{
    Initialize();
    InitAmr();
}